

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spriteview.cpp
# Opt level: O0

void __thiscall FSSSpriteView::setSprite(FSSSpriteView *this,PSprite *_sprite)

{
  FSSClickableLabel *pFVar1;
  byte bVar2;
  QPixmap local_68 [28];
  QSize local_4c;
  QSize size;
  undefined1 local_30 [8];
  QPixmap pixmap;
  PSprite *_sprite_local;
  FSSSpriteView *this_local;
  
  std::shared_ptr<Data::Sprite>::operator=(&this->sprite,_sprite);
  QWidget::setBackgroundRole((ColorRole)this->labelImage);
  QWidget::setSizePolicy((QWidget *)this->labelImage,Ignored,Ignored);
  QLabel::setScaledContents(SUB81(this->labelImage,0));
  QWidget::setSizePolicy((QWidget *)this->labelImage,MinimumExpanding,MinimumExpanding);
  getPixmap((FSSSpriteView *)local_30);
  bVar2 = QPixmap::isNull();
  if ((bVar2 & 1) == 0) {
    local_4c = (QSize)QPixmap::size();
    QSize::operator*=(&local_4c,2.0);
    QPixmap::scaled((QSize *)local_68,(AspectRatioMode)local_30,(TransformationMode)&local_4c);
    QPixmap::operator=((QPixmap *)local_30,local_68);
    QPixmap::~QPixmap(local_68);
    QWidget::resize((QSize *)this->labelImage);
  }
  else {
    pFVar1 = this->labelImage;
    QSize::QSize(&size);
    QWidget::resize((QSize *)pFVar1);
  }
  QLabel::setPixmap((QPixmap *)this->labelImage);
  QWidget::update();
  QPixmap::~QPixmap((QPixmap *)local_30);
  return;
}

Assistant:

void
FSSSpriteView::setSprite(Data::PSprite _sprite) {
  sprite = _sprite;

  labelImage->setBackgroundRole(QPalette::LinkVisited);
  labelImage->setSizePolicy(QSizePolicy::Ignored,
                            QSizePolicy::Ignored);
  labelImage->setScaledContents(false);
  labelImage->setSizePolicy(QSizePolicy::MinimumExpanding,
                            QSizePolicy::MinimumExpanding);
  QPixmap pixmap = getPixmap();
  if (pixmap.isNull()) {
    labelImage->resize(QSize());
  } else {
    QSize size = pixmap.size();
    size *= 2;
    pixmap = pixmap.scaled(size);
    labelImage->resize(size);
  }
  labelImage->setPixmap(pixmap);

  update();
}